

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

void delete_node(qnode_ptr_t p,qnode_ptr_t *h,qnode_ptr_t *q)

{
  t_qnode *ptVar1;
  qnode_ptr_t ptVar2;
  t_qnode **pptVar3;
  
  ptVar1 = p->forth;
  pptVar3 = &ptVar1->back;
  if (ptVar1 == (t_qnode *)0x0) {
    pptVar3 = q;
  }
  ptVar2 = p->back;
  *pptVar3 = ptVar2;
  pptVar3 = &ptVar2->forth;
  if (ptVar2 == (qnode_ptr_t)0x0) {
    pptVar3 = h;
  }
  *pptVar3 = ptVar1;
  free(p);
  return;
}

Assistant:

void delete_node(p,h,q)
qnode_ptr_t p, *h, *q ;

{ qnode_ptr_t s, t ;

  s = p->back ;
  t = p->forth ;
  if (t != (qnode_ptr_t)NULL) {
    t->back = s ;
  }
  else {
    *q = s ;
  }
  if (s != (qnode_ptr_t)NULL) {
    s->forth = t ;
  }
  else {
    *h = t ;
  }
  free(p) ;
}